

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__bmp_parse_header(stbi__context *s,stbi__bmp_data *info)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  stbi__uint32 sVar4;
  stbi_uc *psVar5;
  char *pcVar6;
  stbi_uc *psVar7;
  long in_FS_OFFSET;
  
  psVar7 = s->img_buffer;
  if (psVar7 < s->img_buffer_end) {
LAB_0011c5dd:
    psVar5 = psVar7 + 1;
    s->img_buffer = psVar5;
    if (*psVar7 == 'B') {
      if (s->img_buffer_end <= psVar5) {
        if (s->read_from_callbacks == 0) goto LAB_0011c744;
        stbi__refill_buffer(s);
        psVar5 = s->img_buffer;
      }
      s->img_buffer = psVar5 + 1;
      if (*psVar5 == 'M') {
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar1 = stbi__get16le(s);
        iVar2 = stbi__get16le(s);
        info->offset = iVar2 << 0x10 | uVar1;
        uVar1 = stbi__get16le(s);
        iVar2 = stbi__get16le(s);
        uVar1 = iVar2 << 0x10 | uVar1;
        info->hsz = uVar1;
        info->mr = 0;
        info->mg = 0;
        info->mb = 0;
        info->ma = 0;
        info->extra_read = 0xe;
        if (-1 < info->offset) {
          if ((int)uVar1 < 0x38) {
            if (uVar1 != 0xc) {
              if (uVar1 != 0x28) goto LAB_0011c777;
              goto LAB_0011c6b8;
            }
            sVar4 = stbi__get16le(s);
            s->img_x = sVar4;
            uVar3 = stbi__get16le(s);
          }
          else {
            if (((uVar1 != 0x38) && (uVar1 != 0x6c)) && (uVar1 != 0x7c)) {
LAB_0011c777:
              pcVar6 = "unknown BMP";
              goto LAB_0011c74b;
            }
LAB_0011c6b8:
            uVar3 = stbi__get16le(s);
            iVar2 = stbi__get16le(s);
            s->img_x = iVar2 << 0x10 | uVar3;
            uVar3 = stbi__get16le(s);
            iVar2 = stbi__get16le(s);
            uVar3 = iVar2 << 0x10 | uVar3;
          }
          s->img_y = uVar3;
          iVar2 = stbi__get16le(s);
          if (iVar2 == 1) {
            iVar2 = stbi__get16le(s);
            info->bpp = iVar2;
            if (uVar1 == 0xc) {
              return (void *)0x1;
            }
            uVar3 = stbi__get16le(s);
            iVar2 = stbi__get16le(s);
            if ((iVar2 * 0x10000 + uVar3) - 1 < 2) {
              pcVar6 = "BMP RLE";
              goto LAB_0011c74b;
            }
            uVar3 = iVar2 * 0x10000 | uVar3;
            if (3 < (int)uVar3) {
              pcVar6 = "BMP JPEG/PNG";
              goto LAB_0011c74b;
            }
            if (((uVar3 != 3) || (info->bpp == 0x10)) || (info->bpp == 0x20)) {
              stbi__get32le(s);
              stbi__get32le(s);
              stbi__get32le(s);
              stbi__get32le(s);
              stbi__get32le(s);
              if ((int)uVar1 < 0x6c) {
                if (uVar1 != 0x28) {
                  if (uVar1 != 0x38) goto LAB_0011c92e;
                  stbi__get32le(s);
                  stbi__get32le(s);
                  stbi__get32le(s);
                  stbi__get32le(s);
                }
                iVar2 = info->bpp;
                if ((iVar2 != 0x20) && (iVar2 != 0x10)) {
                  return (void *)0x1;
                }
                if (uVar3 == 0) {
                  if (iVar2 == 0x20) {
                    info->mr = 0xff0000;
                    info->mg = 0xff00;
                    info->mb = 0xff;
                    info->ma = 0xff000000;
                    info->all_a = 0;
                    return (void *)0x1;
                  }
                  if (iVar2 != 0x10) {
                    info->mr = 0;
                    info->mg = 0;
                    info->mb = 0;
                    info->ma = 0;
                    return (void *)0x1;
                  }
                  info->mr = 0x7c00;
                  info->mg = 0x3e0;
                  info->mb = 0x1f;
                  return (void *)0x1;
                }
                if (uVar3 == 3) {
                  sVar4 = stbi__get32le(s);
                  info->mr = sVar4;
                  sVar4 = stbi__get32le(s);
                  info->mg = sVar4;
                  sVar4 = stbi__get32le(s);
                  info->mb = sVar4;
                  info->extra_read = info->extra_read + 0xc;
                  if (info->mg != sVar4 || info->mr != info->mg) {
                    return (void *)0x1;
                  }
                }
              }
              else if ((uVar1 == 0x6c) || (uVar1 == 0x7c)) {
                sVar4 = stbi__get32le(s);
                info->mr = sVar4;
                sVar4 = stbi__get32le(s);
                info->mg = sVar4;
                sVar4 = stbi__get32le(s);
                info->mb = sVar4;
                sVar4 = stbi__get32le(s);
                info->ma = sVar4;
                if (uVar3 != 3) {
                  stbi__bmp_set_mask_defaults(info,uVar3);
                }
                stbi__get32le(s);
                iVar2 = 0xc;
                do {
                  stbi__get16le(s);
                  stbi__get16le(s);
                  iVar2 = iVar2 + -1;
                } while (iVar2 != 0);
                if (uVar1 != 0x6c) {
                  if (uVar1 != 0x7c) {
                    return (void *)0x0;
                  }
                  stbi__get32le(s);
                  stbi__get32le(s);
                  stbi__get32le(s);
                  stbi__get32le(s);
                  return (void *)0x1;
                }
                return (void *)0x1;
              }
            }
          }
        }
LAB_0011c92e:
        pcVar6 = "bad BMP";
        goto LAB_0011c74b;
      }
    }
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    psVar7 = s->img_buffer;
    goto LAB_0011c5dd;
  }
LAB_0011c744:
  pcVar6 = "not BMP";
LAB_0011c74b:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar6;
  return (void *)0x0;
}

Assistant:

static void *stbi__bmp_parse_header(stbi__context *s, stbi__bmp_data *info)
{
   int hsz;
   if (stbi__get8(s) != 'B' || stbi__get8(s) != 'M') return stbi__errpuc("not BMP", "Corrupt BMP");
   stbi__get32le(s); // discard filesize
   stbi__get16le(s); // discard reserved
   stbi__get16le(s); // discard reserved
   info->offset = stbi__get32le(s);
   info->hsz = hsz = stbi__get32le(s);
   info->mr = info->mg = info->mb = info->ma = 0;
   info->extra_read = 14;

   if (info->offset < 0) return stbi__errpuc("bad BMP", "bad BMP");

   if (hsz != 12 && hsz != 40 && hsz != 56 && hsz != 108 && hsz != 124) return stbi__errpuc("unknown BMP", "BMP type not supported: unknown");
   if (hsz == 12) {
      s->img_x = stbi__get16le(s);
      s->img_y = stbi__get16le(s);
   } else {
      s->img_x = stbi__get32le(s);
      s->img_y = stbi__get32le(s);
   }
   if (stbi__get16le(s) != 1) return stbi__errpuc("bad BMP", "bad BMP");
   info->bpp = stbi__get16le(s);
   if (hsz != 12) {
      int compress = stbi__get32le(s);
      if (compress == 1 || compress == 2) return stbi__errpuc("BMP RLE", "BMP type not supported: RLE");
      if (compress >= 4) return stbi__errpuc("BMP JPEG/PNG", "BMP type not supported: unsupported compression"); // this includes PNG/JPEG modes
      if (compress == 3 && info->bpp != 16 && info->bpp != 32) return stbi__errpuc("bad BMP", "bad BMP"); // bitfields requires 16 or 32 bits/pixel
      stbi__get32le(s); // discard sizeof
      stbi__get32le(s); // discard hres
      stbi__get32le(s); // discard vres
      stbi__get32le(s); // discard colorsused
      stbi__get32le(s); // discard max important
      if (hsz == 40 || hsz == 56) {
         if (hsz == 56) {
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
         }
         if (info->bpp == 16 || info->bpp == 32) {
            if (compress == 0) {
               stbi__bmp_set_mask_defaults(info, compress);
            } else if (compress == 3) {
               info->mr = stbi__get32le(s);
               info->mg = stbi__get32le(s);
               info->mb = stbi__get32le(s);
               info->extra_read += 12;
               // not documented, but generated by photoshop and handled by mspaint
               if (info->mr == info->mg && info->mg == info->mb) {
                  // ?!?!?
                  return stbi__errpuc("bad BMP", "bad BMP");
               }
            } else
               return stbi__errpuc("bad BMP", "bad BMP");
         }
      } else {
         // V4/V5 header
         int i;
         if (hsz != 108 && hsz != 124)
            return stbi__errpuc("bad BMP", "bad BMP");
         info->mr = stbi__get32le(s);
         info->mg = stbi__get32le(s);
         info->mb = stbi__get32le(s);
         info->ma = stbi__get32le(s);
         if (compress != 3) // override mr/mg/mb unless in BI_BITFIELDS mode, as per docs
            stbi__bmp_set_mask_defaults(info, compress);
         stbi__get32le(s); // discard color space
         for (i=0; i < 12; ++i)
            stbi__get32le(s); // discard color space parameters
         if (hsz == 124) {
            stbi__get32le(s); // discard rendering intent
            stbi__get32le(s); // discard offset of profile data
            stbi__get32le(s); // discard size of profile data
            stbi__get32le(s); // discard reserved
         }
      }
   }
   return (void *) 1;
}